

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestResultTest.cpp
# Opt level: O0

void __thiscall
TEST_TestResult_TestEndedWillPrintResultsAndExecutionTime_Test::testBody
          (TEST_TestResult_TestEndedWillPrintResultsAndExecutionTime_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  SimpleString *this_00;
  TestTerminator *pTVar3;
  SimpleString local_20;
  TEST_TestResult_TestEndedWillPrintResultsAndExecutionTime_Test *local_10;
  TEST_TestResult_TestEndedWillPrintResultsAndExecutionTime_Test *this_local;
  
  local_10 = this;
  (*((this->super_TEST_GROUP_CppUTestGroupTestResult).res)->_vptr_TestResult[3])();
  pUVar2 = UtestShell::getCurrent();
  this_00 = StringBufferTestOutput::getOutput((this->super_TEST_GROUP_CppUTestGroupTestResult).mock)
  ;
  SimpleString::SimpleString(&local_20,"10 ms");
  bVar1 = SimpleString::contains(this_00,&local_20);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","mock->getOutput().contains(\"10 ms\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestResultTest.cpp"
             ,0x41,pTVar3);
  SimpleString::~SimpleString(&local_20);
  return;
}

Assistant:

TEST(TestResult, TestEndedWillPrintResultsAndExecutionTime)
{
    res->testsEnded();
    CHECK(mock->getOutput().contains("10 ms"));
}